

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,int number,Extension *other_extension)

{
  byte *pbVar1;
  Arena *pAVar2;
  byte bVar3;
  int iVar4;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var5;
  LogMessage *pLVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  string *psVar9;
  Type *pTVar10;
  undefined4 extraout_var;
  int64 iVar11;
  long lVar12;
  size_t __n;
  _Base_ptr *__src;
  _Base_ptr *__dest;
  int index;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar13;
  LogFinisher local_151;
  ExtensionSet *local_150;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (other_extension->is_repeated != true) {
    if ((other_extension->field_0xa & 1) == 0) {
      bVar3 = other_extension->type;
      if ((byte)(bVar3 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_148,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x34);
        pLVar6 = LogMessage::operator<<
                           (&local_148,
                            "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=((LogFinisher *)&local_110,pLVar6);
        LogMessage::~LogMessage(&local_148);
      }
      switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar3 * 4)) {
      case 1:
        SetInt32(this,number,other_extension->type,(other_extension->field_0).int32_value,
                 other_extension->descriptor);
        return;
      case 2:
        SetInt64(this,number,other_extension->type,(other_extension->field_0).int64_value,
                 other_extension->descriptor);
        return;
      case 3:
        SetUInt32(this,number,other_extension->type,(other_extension->field_0).uint32_value,
                  other_extension->descriptor);
        return;
      case 4:
        SetUInt64(this,number,other_extension->type,(other_extension->field_0).uint64_value,
                  other_extension->descriptor);
        return;
      case 5:
        SetDouble(this,number,other_extension->type,(other_extension->field_0).double_value,
                  other_extension->descriptor);
        return;
      case 6:
        SetFloat(this,number,other_extension->type,(other_extension->field_0).float_value,
                 other_extension->descriptor);
        return;
      case 7:
        SetBool(this,number,other_extension->type,(other_extension->field_0).bool_value,
                other_extension->descriptor);
        return;
      case 8:
        SetEnum(this,number,other_extension->type,(other_extension->field_0).enum_value,
                other_extension->descriptor);
        return;
      case 9:
        psVar9 = MutableString_abi_cxx11_
                           (this,number,other_extension->type,other_extension->descriptor);
        std::__cxx11::string::_M_assign((string *)psVar9);
        return;
      case 10:
        goto switchD_0034c623_caseD_a;
      default:
        return;
      }
    }
    return;
  }
  p_Var7 = (_Base_ptr)other_extension->descriptor;
  local_148.filename_ = (char *)0x0;
  local_148.line_ = 0;
  local_148._20_4_ = 0;
  local_148.message_._M_dataplus._M_p = (pointer)0x0;
  local_150 = this;
  local_148.level_ = number;
  pVar13 = std::
           _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
           ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                     ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                       *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                              &local_148);
  _Var5 = pVar13.first._M_node;
  _Var5._M_node[1]._M_right = p_Var7;
  if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(FieldType *)&_Var5._M_node[1]._M_left != other_extension->type) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x37a);
      pLVar6 = LogMessage::operator<<
                         (&local_a0,"CHECK failed: (extension->type) == (other_extension.type): ");
      LogFinisher::operator=((LogFinisher *)&local_148,pLVar6);
      LogMessage::~LogMessage(&local_a0);
    }
    if ((bool)*(char *)((long)&_Var5._M_node[1]._M_left + 3) != other_extension->is_packed) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x37b);
      pLVar6 = LogMessage::operator<<
                         (&local_d8,
                          "CHECK failed: (extension->is_packed) == (other_extension.is_packed): ");
      LogFinisher::operator=((LogFinisher *)&local_148,pLVar6);
      LogMessage::~LogMessage(&local_d8);
    }
    if (*(char *)((long)&_Var5._M_node[1]._M_left + 1) == '\0') {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x37c);
      pLVar6 = LogMessage::operator<<(&local_68,"CHECK failed: extension->is_repeated: ");
      LogFinisher::operator=((LogFinisher *)&local_148,pLVar6);
      LogMessage::~LogMessage(&local_68);
    }
  }
  else {
    *(FieldType *)&_Var5._M_node[1]._M_left = other_extension->type;
    *(bool *)((long)&_Var5._M_node[1]._M_left + 3) = other_extension->is_packed;
    *(undefined1 *)((long)&_Var5._M_node[1]._M_left + 1) = 1;
  }
  bVar3 = other_extension->type;
  if ((byte)(bVar3 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x34);
    pLVar6 = LogMessage::operator<<
                       (&local_110,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=((LogFinisher *)&local_148,pLVar6);
    LogMessage::~LogMessage(&local_110);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar3 * 4)) {
  case 1:
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar2 = local_150->arena_;
      if (pAVar2 == (Arena *)0x0) {
        p_Var7 = (_Base_ptr)operator_new(0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = (_Base_ptr)
                 Arena::AllocateAligned(pAVar2,(type_info *)&RepeatedField<int>::typeinfo,0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var8 = (_Base_ptr)Arena::AllocateAligned(pAVar2,(type_info *)&char::typeinfo,8);
        p_Var7->_M_parent = p_Var8;
        *(Arena **)p_Var8 = pAVar2;
        Arena::AddListNode(pAVar2,p_Var7,arena_destruct_object<google::protobuf::RepeatedField<int>>
                          );
      }
      _Var5._M_node[1]._M_parent = p_Var7;
    }
    p_Var7 = _Var5._M_node[1]._M_parent;
    p_Var8 = (_Base_ptr)(other_extension->field_0).repeated_int32_value;
    if (p_Var8 == p_Var7) {
      LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4b6);
      pLVar6 = LogMessage::operator<<(&local_148,"CHECK failed: (&other) != (this): ");
      LogFinisher::operator=(&local_151,pLVar6);
LAB_0034d143:
      LogMessage::~LogMessage(&local_148);
    }
    goto LAB_0034d14d;
  case 2:
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar2 = local_150->arena_;
      if (pAVar2 == (Arena *)0x0) {
        p_Var7 = (_Base_ptr)operator_new(0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = (_Base_ptr)
                 Arena::AllocateAligned(pAVar2,(type_info *)&RepeatedField<long>::typeinfo,0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var8 = (_Base_ptr)Arena::AllocateAligned(pAVar2,(type_info *)&char::typeinfo,8);
        p_Var7->_M_parent = p_Var8;
        *(Arena **)p_Var8 = pAVar2;
        Arena::AddListNode(pAVar2,p_Var7,
                           arena_destruct_object<google::protobuf::RepeatedField<long>>);
      }
      _Var5._M_node[1]._M_parent = p_Var7;
    }
    p_Var7 = _Var5._M_node[1]._M_parent;
    p_Var8 = (_Base_ptr)(other_extension->field_0).repeated_int32_value;
    if (p_Var8 == p_Var7) {
      LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4b6);
      pLVar6 = LogMessage::operator<<(&local_148,"CHECK failed: (&other) != (this): ");
      LogFinisher::operator=(&local_151,pLVar6);
      LogMessage::~LogMessage(&local_148);
    }
    if (p_Var8->_M_color == _S_red) {
      return;
    }
    RepeatedField<long>::Reserve((RepeatedField<long> *)p_Var7,p_Var8->_M_color + p_Var7->_M_color);
    goto LAB_0034d1eb;
  case 3:
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar2 = local_150->arena_;
      if (pAVar2 == (Arena *)0x0) {
        p_Var7 = (_Base_ptr)operator_new(0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = (_Base_ptr)
                 Arena::AllocateAligned
                           (pAVar2,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var8 = (_Base_ptr)Arena::AllocateAligned(pAVar2,(type_info *)&char::typeinfo,8);
        p_Var7->_M_parent = p_Var8;
        *(Arena **)p_Var8 = pAVar2;
        Arena::AddListNode(pAVar2,p_Var7,
                           arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>);
      }
      _Var5._M_node[1]._M_parent = p_Var7;
    }
    p_Var7 = _Var5._M_node[1]._M_parent;
    p_Var8 = (_Base_ptr)(other_extension->field_0).repeated_int32_value;
    if (p_Var8 == p_Var7) {
      LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4b6);
      pLVar6 = LogMessage::operator<<(&local_148,"CHECK failed: (&other) != (this): ");
      LogFinisher::operator=(&local_151,pLVar6);
      LogMessage::~LogMessage(&local_148);
    }
    if (p_Var8->_M_color == _S_red) {
      return;
    }
    RepeatedField<unsigned_int>::Reserve
              ((RepeatedField<unsigned_int> *)p_Var7,p_Var8->_M_color + p_Var7->_M_color);
    break;
  case 4:
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar2 = local_150->arena_;
      if (pAVar2 == (Arena *)0x0) {
        p_Var7 = (_Base_ptr)operator_new(0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = (_Base_ptr)
                 Arena::AllocateAligned
                           (pAVar2,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var8 = (_Base_ptr)Arena::AllocateAligned(pAVar2,(type_info *)&char::typeinfo,8);
        p_Var7->_M_parent = p_Var8;
        *(Arena **)p_Var8 = pAVar2;
        Arena::AddListNode(pAVar2,p_Var7,
                           arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>);
      }
      _Var5._M_node[1]._M_parent = p_Var7;
    }
    p_Var7 = _Var5._M_node[1]._M_parent;
    p_Var8 = (_Base_ptr)(other_extension->field_0).repeated_int32_value;
    if (p_Var8 == p_Var7) {
      LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4b6);
      pLVar6 = LogMessage::operator<<(&local_148,"CHECK failed: (&other) != (this): ");
      LogFinisher::operator=(&local_151,pLVar6);
      LogMessage::~LogMessage(&local_148);
    }
    if (p_Var8->_M_color == _S_red) {
      return;
    }
    RepeatedField<unsigned_long>::Reserve
              ((RepeatedField<unsigned_long> *)p_Var7,p_Var8->_M_color + p_Var7->_M_color);
    goto LAB_0034d1eb;
  case 5:
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar2 = local_150->arena_;
      if (pAVar2 == (Arena *)0x0) {
        p_Var7 = (_Base_ptr)operator_new(0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = (_Base_ptr)
                 Arena::AllocateAligned(pAVar2,(type_info *)&RepeatedField<double>::typeinfo,0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var8 = (_Base_ptr)Arena::AllocateAligned(pAVar2,(type_info *)&char::typeinfo,8);
        p_Var7->_M_parent = p_Var8;
        *(Arena **)p_Var8 = pAVar2;
        Arena::AddListNode(pAVar2,p_Var7,
                           arena_destruct_object<google::protobuf::RepeatedField<double>>);
      }
      _Var5._M_node[1]._M_parent = p_Var7;
    }
    p_Var7 = _Var5._M_node[1]._M_parent;
    p_Var8 = (_Base_ptr)(other_extension->field_0).repeated_int32_value;
    if (p_Var8 == p_Var7) {
      LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4b6);
      pLVar6 = LogMessage::operator<<(&local_148,"CHECK failed: (&other) != (this): ");
      LogFinisher::operator=(&local_151,pLVar6);
      LogMessage::~LogMessage(&local_148);
    }
    if (p_Var8->_M_color == _S_red) {
      return;
    }
    RepeatedField<double>::Reserve
              ((RepeatedField<double> *)p_Var7,p_Var8->_M_color + p_Var7->_M_color);
LAB_0034d1eb:
    __dest = &p_Var7->_M_parent->_M_parent + (int)p_Var7->_M_color;
    __src = &p_Var8->_M_parent->_M_parent;
    __n = (long)(int)p_Var8->_M_color << 3;
    goto LAB_0034d2a8;
  case 6:
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar2 = local_150->arena_;
      if (pAVar2 == (Arena *)0x0) {
        p_Var7 = (_Base_ptr)operator_new(0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = (_Base_ptr)
                 Arena::AllocateAligned(pAVar2,(type_info *)&RepeatedField<float>::typeinfo,0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var8 = (_Base_ptr)Arena::AllocateAligned(pAVar2,(type_info *)&char::typeinfo,8);
        p_Var7->_M_parent = p_Var8;
        *(Arena **)p_Var8 = pAVar2;
        Arena::AddListNode(pAVar2,p_Var7,
                           arena_destruct_object<google::protobuf::RepeatedField<float>>);
      }
      _Var5._M_node[1]._M_parent = p_Var7;
    }
    p_Var7 = _Var5._M_node[1]._M_parent;
    p_Var8 = (_Base_ptr)(other_extension->field_0).repeated_int32_value;
    if (p_Var8 == p_Var7) {
      LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4b6);
      pLVar6 = LogMessage::operator<<(&local_148,"CHECK failed: (&other) != (this): ");
      LogFinisher::operator=(&local_151,pLVar6);
      LogMessage::~LogMessage(&local_148);
    }
    if (p_Var8->_M_color == _S_red) {
      return;
    }
    RepeatedField<float>::Reserve
              ((RepeatedField<float> *)p_Var7,p_Var8->_M_color + p_Var7->_M_color);
    break;
  case 7:
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar2 = local_150->arena_;
      if (pAVar2 == (Arena *)0x0) {
        p_Var7 = (_Base_ptr)operator_new(0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = (_Base_ptr)
                 Arena::AllocateAligned(pAVar2,(type_info *)&RepeatedField<bool>::typeinfo,0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var8 = (_Base_ptr)Arena::AllocateAligned(pAVar2,(type_info *)&char::typeinfo,8);
        p_Var7->_M_parent = p_Var8;
        *(Arena **)p_Var8 = pAVar2;
        Arena::AddListNode(pAVar2,p_Var7,
                           arena_destruct_object<google::protobuf::RepeatedField<bool>>);
      }
      _Var5._M_node[1]._M_parent = p_Var7;
    }
    p_Var7 = _Var5._M_node[1]._M_parent;
    p_Var8 = (_Base_ptr)(other_extension->field_0).repeated_int32_value;
    if (p_Var8 == p_Var7) {
      LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4b6);
      pLVar6 = LogMessage::operator<<(&local_148,"CHECK failed: (&other) != (this): ");
      LogFinisher::operator=(&local_151,pLVar6);
      LogMessage::~LogMessage(&local_148);
    }
    if (p_Var8->_M_color == _S_red) {
      return;
    }
    RepeatedField<bool>::Reserve((RepeatedField<bool> *)p_Var7,p_Var8->_M_color + p_Var7->_M_color);
    __dest = (_Base_ptr *)((long)&p_Var7->_M_parent->_M_parent + (long)(int)p_Var7->_M_color);
    __src = &p_Var8->_M_parent->_M_parent;
    __n = (size_t)(int)p_Var8->_M_color;
    goto LAB_0034d2a8;
  case 8:
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar2 = local_150->arena_;
      if (pAVar2 == (Arena *)0x0) {
        p_Var7 = (_Base_ptr)operator_new(0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = (_Base_ptr)
                 Arena::AllocateAligned(pAVar2,(type_info *)&RepeatedField<int>::typeinfo,0x10);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var8 = (_Base_ptr)Arena::AllocateAligned(pAVar2,(type_info *)&char::typeinfo,8);
        p_Var7->_M_parent = p_Var8;
        *(Arena **)p_Var8 = pAVar2;
        Arena::AddListNode(pAVar2,p_Var7,arena_destruct_object<google::protobuf::RepeatedField<int>>
                          );
      }
      _Var5._M_node[1]._M_parent = p_Var7;
    }
    p_Var7 = _Var5._M_node[1]._M_parent;
    p_Var8 = (_Base_ptr)(other_extension->field_0).repeated_int32_value;
    if (p_Var8 == p_Var7) {
      LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4b6);
      pLVar6 = LogMessage::operator<<(&local_148,"CHECK failed: (&other) != (this): ");
      LogFinisher::operator=(&local_151,pLVar6);
      goto LAB_0034d143;
    }
LAB_0034d14d:
    if (p_Var8->_M_color == _S_red) {
      return;
    }
    RepeatedField<int>::Reserve((RepeatedField<int> *)p_Var7,p_Var8->_M_color + p_Var7->_M_color);
    break;
  case 9:
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar2 = local_150->arena_;
      if (pAVar2 == (Arena *)0x0) {
        p_Var7 = (_Base_ptr)operator_new(0x18);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var7->_M_left = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = (_Base_ptr)
                 Arena::AllocateAligned
                           (pAVar2,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,
                            0x18);
        *(Arena **)p_Var7 = pAVar2;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var7->_M_left = (_Base_ptr)0x0;
        Arena::AddListNode(pAVar2,p_Var7,
                           arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                          );
      }
      _Var5._M_node[1]._M_parent = p_Var7;
    }
    RepeatedPtrFieldBase::
    MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              ((RepeatedPtrFieldBase *)_Var5._M_node[1]._M_parent,
               (RepeatedPtrFieldBase *)(other_extension->field_0).string_value);
    return;
  case 10:
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar2 = local_150->arena_;
      if (pAVar2 == (Arena *)0x0) {
        p_Var7 = (_Base_ptr)operator_new(0x18);
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var7->_M_left = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = (_Base_ptr)
                 Arena::AllocateAligned
                           (pAVar2,(type_info *)
                                   &RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,0x18);
        *(Arena **)p_Var7 = pAVar2;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var7->_M_left = (_Base_ptr)0x0;
        Arena::AddListNode(pAVar2,p_Var7,
                           arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                          );
      }
      _Var5._M_node[1]._M_parent = p_Var7;
    }
    psVar9 = (other_extension->field_0).string_value;
    if (0 < (int)psVar9->_M_string_length) {
      index = 0;
      do {
        pTVar10 = RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                            ((RepeatedPtrFieldBase *)psVar9,index);
        p_Var7 = _Var5._M_node[1]._M_parent;
        p_Var8 = p_Var7->_M_left;
        if (p_Var8 == (_Base_ptr)0x0) {
LAB_0034cf35:
          p_Var7 = (_Base_ptr)0x0;
        }
        else {
          iVar4 = *(int *)&p_Var7->_M_parent;
          if ((int)p_Var8->_M_color <= iVar4) goto LAB_0034cf35;
          *(int *)&p_Var7->_M_parent = iVar4 + 1;
          p_Var7 = (&p_Var8->_M_parent)[iVar4];
        }
        if (p_Var7 == (_Base_ptr)0x0) {
          iVar4 = (*pTVar10->_vptr_MessageLite[4])(pTVar10,local_150->arena_);
          p_Var7 = (_Base_ptr)CONCAT44(extraout_var,iVar4);
          RepeatedPtrFieldBase::
          AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                    ((RepeatedPtrFieldBase *)_Var5._M_node[1]._M_parent,p_Var7);
        }
        (**(code **)(*(long *)p_Var7 + 0x50))(p_Var7,pTVar10);
        index = index + 1;
      } while (index < (int)psVar9->_M_string_length);
    }
  default:
    goto switchD_0034c7c3_default;
  }
  __dest = (_Base_ptr *)((long)&p_Var7->_M_parent->_M_parent + (long)(int)p_Var7->_M_color * 4);
  __src = &p_Var8->_M_parent->_M_parent;
  __n = (long)(int)p_Var8->_M_color << 2;
LAB_0034d2a8:
  memcpy(__dest,__src,__n);
  p_Var7->_M_color = p_Var7->_M_color + p_Var8->_M_color;
switchD_0034c7c3_default:
  return;
switchD_0034c623_caseD_a:
  p_Var7 = (_Base_ptr)other_extension->descriptor;
  local_110.filename_ = (char *)0x0;
  local_110.line_ = 0;
  local_110._20_4_ = 0;
  local_110.message_._M_dataplus._M_p = (pointer)0x0;
  local_110.level_ = number;
  pVar13 = std::
           _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
           ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                     ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                       *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                              &local_110);
  _Var5 = pVar13.first._M_node;
  _Var5._M_node[1]._M_right = p_Var7;
  if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(FieldType *)&_Var5._M_node[1]._M_left != other_extension->type) {
      LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3d9);
      pLVar6 = LogMessage::operator<<
                         (&local_110,"CHECK failed: (extension->type) == (other_extension.type): ");
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar6);
      LogMessage::~LogMessage(&local_110);
    }
    if ((bool)*(char *)((long)&_Var5._M_node[1]._M_left + 3) != other_extension->is_packed) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3da);
      pLVar6 = LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: (extension->is_packed) == (other_extension.is_packed): ");
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar6);
      LogMessage::~LogMessage(&local_a0);
    }
    if (*(char *)((long)&_Var5._M_node[1]._M_left + 1) == '\x01') {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3db);
      pLVar6 = LogMessage::operator<<(&local_d8,"CHECK failed: !extension->is_repeated: ");
      LogFinisher::operator=((LogFinisher *)&local_68,pLVar6);
      LogMessage::~LogMessage(&local_d8);
    }
    p_Var7 = _Var5._M_node[1]._M_parent;
    if ((other_extension->field_0xa & 0x10) == 0) {
      if (((ulong)_Var5._M_node[1]._M_left & 0x100000) == 0) {
        (**(code **)(*(long *)p_Var7 + 0x50))();
        goto LAB_0034d3e4;
      }
      p_Var7 = (_Base_ptr)(**(code **)(*(long *)p_Var7 + 0x20))(p_Var7);
      goto LAB_0034d3d8;
    }
    if (((ulong)_Var5._M_node[1]._M_left & 0x100000) != 0) {
      (**(code **)(*(long *)p_Var7 + 0x60))(p_Var7);
      goto LAB_0034d3e4;
    }
    iVar11 = (**(code **)((((other_extension->field_0).repeated_string_value)->
                          super_RepeatedPtrFieldBase).arena_ + 0x18))
                       ((other_extension->field_0).repeated_string_value,p_Var7);
    lVar12 = *(long *)p_Var7;
  }
  else {
    *(FieldType *)&_Var5._M_node[1]._M_left = other_extension->type;
    *(bool *)((long)&_Var5._M_node[1]._M_left + 3) = other_extension->is_packed;
    *(undefined1 *)((long)&_Var5._M_node[1]._M_left + 1) = 0;
    bVar3 = *(byte *)((long)&_Var5._M_node[1]._M_left + 2) & 0xf;
    if ((other_extension->field_0xa & 0x10) != 0) {
      *(byte *)((long)&_Var5._M_node[1]._M_left + 2) = bVar3 | 0x10;
      p_Var7 = (_Base_ptr)
               (**(code **)((((other_extension->field_0).repeated_string_value)->
                            super_RepeatedPtrFieldBase).arena_ + 0x10))
                         ((other_extension->field_0).repeated_string_value,this->arena_);
      _Var5._M_node[1]._M_parent = p_Var7;
      (**(code **)(*(long *)p_Var7 + 0x60))(p_Var7,(other_extension->field_0).int64_value);
      goto LAB_0034d3e4;
    }
    *(byte *)((long)&_Var5._M_node[1]._M_left + 2) = bVar3;
    p_Var7 = (_Base_ptr)
             (**(code **)((((other_extension->field_0).repeated_string_value)->
                          super_RepeatedPtrFieldBase).arena_ + 0x20))
                       ((other_extension->field_0).repeated_string_value,this->arena_);
    _Var5._M_node[1]._M_parent = p_Var7;
LAB_0034d3d8:
    iVar11 = (other_extension->field_0).int64_value;
    lVar12 = *(long *)p_Var7;
  }
  (**(code **)(lVar12 + 0x50))(p_Var7,iVar11);
LAB_0034d3e4:
  pbVar1 = (byte *)((long)&_Var5._M_node[1]._M_left + 2);
  *pbVar1 = *pbVar1 & 0xf0;
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(
  int number, const Extension& other_extension) {
  if (other_extension.is_repeated) {
    Extension* extension;
    bool is_new = MaybeNewExtension(number, other_extension.descriptor,
                                    &extension);
    if (is_new) {
      // Extension did not already exist in set.
      extension->type = other_extension.type;
      extension->is_packed = other_extension.is_packed;
      extension->is_repeated = true;
    } else {
      GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
      GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
      GOOGLE_DCHECK(extension->is_repeated);
    }

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE)                    \
      case WireFormatLite::CPPTYPE_##UPPERCASE:                             \
        if (is_new) {                                                       \
          extension->repeated_##LOWERCASE##_value =                         \
            Arena::CreateMessage<REPEATED_TYPE >(arena_);                   \
        }                                                                   \
        extension->repeated_##LOWERCASE##_value->MergeFrom(                 \
          *other_extension.repeated_##LOWERCASE##_value);                   \
        break;

      HANDLE_TYPE(  INT32,   int32, RepeatedField   <  int32>);
      HANDLE_TYPE(  INT64,   int64, RepeatedField   <  int64>);
      HANDLE_TYPE( UINT32,  uint32, RepeatedField   < uint32>);
      HANDLE_TYPE( UINT64,  uint64, RepeatedField   < uint64>);
      HANDLE_TYPE(  FLOAT,   float, RepeatedField   <  float>);
      HANDLE_TYPE( DOUBLE,  double, RepeatedField   < double>);
      HANDLE_TYPE(   BOOL,    bool, RepeatedField   <   bool>);
      HANDLE_TYPE(   ENUM,    enum, RepeatedField   <    int>);
      HANDLE_TYPE( STRING,  string, RepeatedPtrField< string>);
#undef HANDLE_TYPE

      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_new) {
          extension->repeated_message_value =
              Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
        }
        // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
        // it would attempt to allocate new objects.
        RepeatedPtrField<MessageLite>* other_repeated_message =
            other_extension.repeated_message_value;
        for (int i = 0; i < other_repeated_message->size(); i++) {
          const MessageLite& other_message = other_repeated_message->Get(i);
          MessageLite* target = extension->repeated_message_value
                   ->AddFromCleared<GenericTypeHandler<MessageLite> >();
          if (target == NULL) {
            target = other_message.New(arena_);
            extension->repeated_message_value->AddAllocated(target);
          }
          target->CheckTypeAndMergeFrom(other_message);
        }
        break;
    }
  } else {
    if (!other_extension.is_cleared) {
      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)                       \
        case WireFormatLite::CPPTYPE_##UPPERCASE:                          \
          Set##CAMELCASE(number, other_extension.type,                     \
                         other_extension.LOWERCASE##_value,                \
                         other_extension.descriptor);                      \
          break;

        HANDLE_TYPE( INT32,  int32,  Int32);
        HANDLE_TYPE( INT64,  int64,  Int64);
        HANDLE_TYPE(UINT32, uint32, UInt32);
        HANDLE_TYPE(UINT64, uint64, UInt64);
        HANDLE_TYPE( FLOAT,  float,  Float);
        HANDLE_TYPE(DOUBLE, double, Double);
        HANDLE_TYPE(  BOOL,   bool,   Bool);
        HANDLE_TYPE(  ENUM,   enum,   Enum);
#undef HANDLE_TYPE
        case WireFormatLite::CPPTYPE_STRING:
          SetString(number, other_extension.type,
                    *other_extension.string_value,
                    other_extension.descriptor);
          break;
        case WireFormatLite::CPPTYPE_MESSAGE: {
          Extension* extension;
          bool is_new = MaybeNewExtension(number,
                                          other_extension.descriptor,
                                          &extension);
          if (is_new) {
            extension->type = other_extension.type;
            extension->is_packed = other_extension.is_packed;
            extension->is_repeated = false;
            if (other_extension.is_lazy) {
              extension->is_lazy = true;
              extension->lazymessage_value =
                  other_extension.lazymessage_value->New(arena_);
              extension->lazymessage_value->MergeFrom(
                  *other_extension.lazymessage_value);
            } else {
              extension->is_lazy = false;
              extension->message_value =
                  other_extension.message_value->New(arena_);
              extension->message_value->CheckTypeAndMergeFrom(
                  *other_extension.message_value);
            }
          } else {
            GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
            GOOGLE_DCHECK_EQ(extension->is_packed,other_extension.is_packed);
            GOOGLE_DCHECK(!extension->is_repeated);
            if (other_extension.is_lazy) {
              if (extension->is_lazy) {
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    other_extension.lazymessage_value->GetMessage(
                        *extension->message_value));
              }
            } else {
              if (extension->is_lazy) {
                extension->lazymessage_value->MutableMessage(
                    *other_extension.message_value)->CheckTypeAndMergeFrom(
                        *other_extension.message_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            }
          }
          extension->is_cleared = false;
          break;
        }
      }
    }
  }
}